

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::LocalStructTests::init()::Eval_array_member_dynamic_index::eval(deqp::
     gls::ShaderEvalContext__(ShaderEvalContext *c)

{
  long lVar1;
  float afStack_30 [2];
  undefined8 local_28;
  float local_20;
  int aiStack_18 [6];
  
  local_28 = *(undefined8 *)((c->coords).m_data + 1);
  local_20 = (c->coords).m_data[0];
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar1 = 2;
  do {
    (c->color).m_data[aiStack_18[lVar1]] = afStack_30[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }